

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::UnionSchema::addType(UnionSchema *this,Schema *typeSchema)

{
  Type TVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Name *this_00;
  undefined4 extraout_var_01;
  Exception *pEVar6;
  size_t i;
  ulong uVar7;
  allocator<char> local_51;
  string local_50;
  
  TVar1 = ((typeSchema->node_).px)->type_;
  if (TVar1 == AVRO_RECORD) {
    iVar4 = (*((this->super_Schema).node_.px)->_vptr_Node[4])();
    for (uVar7 = 0; CONCAT44(extraout_var,iVar4) != uVar7; uVar7 = uVar7 + 1) {
      peVar2 = (this->super_Schema).node_.px;
      iVar5 = (*peVar2->_vptr_Node[5])(peVar2,uVar7 & 0xffffffff);
      if ((int)(*(long **)CONCAT44(extraout_var_00,iVar5))[1] == 8) {
        this_00 = (Name *)(**(code **)(**(long **)CONCAT44(extraout_var_00,iVar5) + 0x18))();
        iVar5 = (*((typeSchema->node_).px)->_vptr_Node[3])();
        bVar3 = Name::operator==(this_00,(Name *)CONCAT44(extraout_var_01,iVar5));
        if (bVar3) {
          pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Records in unions cannot have duplicate names",&local_51);
          Exception::Exception(pEVar6,&local_50);
          __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
        }
      }
    }
  }
  else if (TVar1 == AVRO_UNION) {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Cannot add unions to unions",&local_51);
    Exception::Exception(pEVar6,&local_50);
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  Node::addLeaf((this->super_Schema).node_.px,&typeSchema->node_);
  return;
}

Assistant:

void
UnionSchema::addType(const Schema &typeSchema) 
{
    if(typeSchema.type() == AVRO_UNION) {
        throw Exception("Cannot add unions to unions");
    }

    if(typeSchema.type() == AVRO_RECORD) {
        // check for duplicate records
        size_t types = node_->leaves();
        for(size_t i = 0; i < types; ++i) {
            const NodePtr &leaf = node_->leafAt(i);
            // TODO, more checks?
            if(leaf->type() == AVRO_RECORD && leaf->name() == typeSchema.root()->name()) {
                throw Exception("Records in unions cannot have duplicate names");
            }
        }
    }

    node_->addLeaf(typeSchema.root());
}